

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

uint32_t asmjit::anon_unknown_32::CodeHolder_hashNameAndFixLen(char *name,size_t *nameLength)

{
  uint32_t uVar1;
  size_t i_1;
  size_t sVar2;
  
  if (*nameLength == 0xffffffffffffffff) {
    uVar1 = 0;
    for (sVar2 = 0; name[sVar2] != 0; sVar2 = sVar2 + 1) {
      uVar1 = uVar1 * 0x1003f + (uint)(byte)name[sVar2];
    }
    *nameLength = sVar2;
  }
  else {
    uVar1 = 0;
    for (sVar2 = 0; *nameLength != sVar2; sVar2 = sVar2 + 1) {
      if (name[sVar2] == 0) {
        return 0x11;
      }
      uVar1 = uVar1 * 0x1003f + (uint)(byte)name[sVar2];
    }
  }
  return uVar1;
}

Assistant:

static uint32_t CodeHolder_hashNameAndFixLen(const char* name, size_t& nameLength) noexcept {
  uint32_t hVal = 0;
  if (nameLength == Globals::kInvalidIndex) {
    size_t i = 0;
    for (;;) {
      uint8_t c = static_cast<uint8_t>(name[i]);
      if (!c) break;
      hVal = Utils::hashRound(hVal, c);
      i++;
    }
    nameLength = i;
  }
  else {
    for (size_t i = 0; i < nameLength; i++) {
      uint8_t c = static_cast<uint8_t>(name[i]);
      if (ASMJIT_UNLIKELY(!c)) return DebugUtils::errored(kErrorInvalidLabelName);
      hVal = Utils::hashRound(hVal, c);
    }
  }
  return hVal;
}